

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_diag.c
# Opt level: O0

rt_function_error_t exec_matrix_diag(rt_function_t *f)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  int local_30;
  int local_2c;
  int j;
  int i;
  float *y;
  float *x;
  matrix_diag_local_context_t *context;
  rt_function_t *f_local;
  
  plVar1 = (long *)f->local_context;
  lVar2 = *(long *)(*plVar1 + 0x18);
  lVar3 = *(long *)(plVar1[3] + 0x18);
  for (local_2c = 0; local_2c < (int)plVar1[2]; local_2c = local_2c + 1) {
    for (local_30 = 0; local_30 < *(int *)((long)plVar1 + 0x2c); local_30 = local_30 + 1) {
      if (local_2c % *(int *)((long)plVar1 + 0x2c) == local_30) {
        *(undefined4 *)(lVar3 + (long)(local_2c * *(int *)((long)plVar1 + 0x2c) + local_30) * 4) =
             *(undefined4 *)(lVar2 + (long)local_2c * 4);
      }
      else {
        *(undefined4 *)(lVar3 + (long)(local_2c * *(int *)((long)plVar1 + 0x2c) + local_30) * 4) = 0
        ;
      }
    }
  }
  return RT_FUNCTION_ERROR_NOERROR;
}

Assistant:

rt_function_error_t exec_matrix_diag(rt_function_t *f) {
  matrix_diag_local_context_t *context =
      (matrix_diag_local_context_t *)(f->local_context);
  float *x = (float *)(context->input->data);
  float *y = (float *)(context->output->data);

  int i, j;
  for (i = 0; i < context->input_size; i++) {
    for (j = 0; j < context->last_ndim; j++) {
      if (i % context->last_ndim == j) {
        y[i * context->last_ndim + j] = x[i];
      } else {
        y[i * context->last_ndim + j] = 0.;
      }
    }
  }
  return RT_FUNCTION_ERROR_NOERROR;
}